

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall WriterTest_WriteWideString_Test::TestBody(WriterTest_WriteWideString_Test *this)

{
  bool bVar1;
  Message *in_stack_00000028;
  AssertHelper *in_stack_00000030;
  AssertionResult gtest_ar;
  wchar_t (*in_stack_ffffffffffffffa8) [4];
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  Type in_stack_ffffffffffffffdc;
  AssertHelper *in_stack_ffffffffffffffe0;
  AssertionResult local_18;
  
  this_00 = &local_18;
  (anonymous_namespace)::WriteChecker<wchar_t>::operator()
            ((WriteChecker<wchar_t> *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
             &this_00->success_,in_stack_ffffffffffffffa8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffe0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12c343);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    testing::internal::AssertHelper::operator=(in_stack_00000030,in_stack_00000028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x12c38f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c3cf);
  return;
}

Assistant:

TEST(WriterTest, WriteWideString) {
  CHECK_WRITE_WCHAR(L"abc");
  // The following line shouldn't compile:
  //std::declval<fmt::basic_writer<fmt::wbuffer>>().write("abc");
}